

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcTypeProduct::~IfcTypeProduct(IfcTypeProduct *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)&this->super_IfcTypeObject = pvVar1;
  *(void **)(&(this->super_IfcTypeObject).field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x12];
  *(void **)&(this->super_IfcTypeObject).field_0x88 = vtt[0x13];
  (this->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x14];
  *(void **)&(this->super_IfcTypeObject).field_0xf0 = vtt[0x15];
  std::__cxx11::string::~string((string *)&this->Tag);
  std::
  _Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap>_>_>
  ::~_Vector_base((_Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap>_>_>
                   *)&(this->super_IfcTypeObject).field_0x100);
  IfcTypeObject::~IfcTypeObject(&this->super_IfcTypeObject,vtt + 1);
  return;
}

Assistant:

IfcTypeProduct() : Object("IfcTypeProduct") {}